

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
Add<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *this,
          unsigned_short propertyIndex,PropertyRecord *propertyKey,PropertyAttributes attributes,
          bool isInitialized,bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar3;
  bool bVar4;
  PropertyId propertyId;
  undefined4 *puVar5;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34;
  
  if (propertyKey != (PropertyRecord *)0x0) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_34._0_1_ = (local_34._0_1_ & 0xf0) + 1;
    local_34.Attributes = attributes;
    local_34.propertyIndex = propertyIndex;
    if ((isFixed || usedAsFixed) &&
       (((uint)propertyKey->pid < 0x10 || (*(long *)(this + 0x20) == 0)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    if (((uint)propertyKey->pid < 0x10) || (propertyKey->isSymbol == true)) {
      this[0x28] = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>)
                   ((byte)this[0x28] | 4);
    }
    local_34._0_1_ =
         usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02' | local_34._0_1_ & 0xf1;
    local_40 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyKey;
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              (*(BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                 **)(this + 0x18),(PropertyRecord **)&local_40,&local_34);
    Memory::Recycler::WBSetBit((char *)&local_40);
    local_40 = &pJVar1->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
    pPVar3 = local_40;
    bVar4 = NoSpecialPropertyCache::IsSpecialProperty(propertyKey);
    if ((bVar4) &&
       (this[8] = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>)
                  ((byte)this[8] | 0x80), ((byte)this[9] & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar3);
    }
    Memory::Recycler::WBSetBit((char *)&local_40);
    local_40 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
               &pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
    pPVar3 = local_40;
    if ((attributes & 4) == 0) {
      DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this,false);
      if (((byte)this[9] & 0x20) != 0) {
        propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyKey);
        ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                  ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar3);
      }
    }
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }